

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_enc.c
# Opt level: O3

void VP8AdjustFilterStrength(VP8EncIterator *it)

{
  double dVar1;
  int iVar2;
  VP8Encoder *pVVar3;
  double (*padVar4) [64];
  int s;
  long lVar5;
  int max_level;
  uint uVar6;
  double (*padVar7) [64];
  int iVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  double dVar12;
  
  pVVar3 = it->enc;
  padVar4 = *it->lf_stats;
  if ((LFStats *)padVar4 == (LFStats *)0x0) {
    if (0 < pVVar3->config->filter_strength) {
      iVar2 = (pVVar3->filter_hdr).sharpness;
      lVar5 = 0;
      uVar6 = 0;
      do {
        iVar8 = (int)((uint)*(ushort *)((long)pVVar3->dqm[0].y2.q + lVar5 + 2) *
                     *(int *)((long)&pVVar3->dqm[0].max_edge + lVar5)) >> 3;
        if (0x3e < iVar8) {
          iVar8 = 0x3f;
        }
        uVar10 = *(uint *)((long)&pVVar3->dqm[0].fstrength + lVar5);
        if ((int)uVar10 < (int)(uint)kLevelsFromDelta[iVar2][iVar8]) {
          uVar10 = (uint)kLevelsFromDelta[iVar2][iVar8];
          *(uint *)((long)&pVVar3->dqm[0].fstrength + lVar5) = uVar10;
        }
        if ((int)uVar6 <= (int)uVar10) {
          uVar6 = uVar10;
        }
        lVar5 = lVar5 + 0x2e8;
      } while (lVar5 != 0xba0);
      (pVVar3->filter_hdr).level = uVar6;
      return;
    }
  }
  else {
    lVar5 = 0;
    padVar7 = padVar4;
    do {
      dVar12 = padVar4[lVar5][0] * 1.00001;
      uVar11 = 1;
      uVar9 = 0;
      do {
        dVar1 = (*(double (*) [64])*padVar7)[uVar11];
        if (dVar12 < dVar1) {
          uVar9 = uVar11 & 0xffffffff;
          dVar12 = dVar1;
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != 0x40);
      pVVar3->dqm[lVar5].fstrength = (int)uVar9;
      lVar5 = lVar5 + 1;
      padVar7 = padVar7 + 1;
    } while (lVar5 != 4);
  }
  return;
}

Assistant:

void VP8AdjustFilterStrength(VP8EncIterator* const it) {
  VP8Encoder* const enc = it->enc;
#if !defined(WEBP_REDUCE_SIZE)
  if (it->lf_stats != NULL) {
    int s;
    for (s = 0; s < NUM_MB_SEGMENTS; s++) {
      int i, best_level = 0;
      // Improvement over filter level 0 should be at least 1e-5 (relatively)
      double best_v = 1.00001 * (*it->lf_stats)[s][0];
      for (i = 1; i < MAX_LF_LEVELS; i++) {
        const double v = (*it->lf_stats)[s][i];
        if (v > best_v) {
          best_v = v;
          best_level = i;
        }
      }
      enc->dqm[s].fstrength = best_level;
    }
    return;
  }
#endif  // !defined(WEBP_REDUCE_SIZE)
  if (enc->config->filter_strength > 0) {
    int max_level = 0;
    int s;
    for (s = 0; s < NUM_MB_SEGMENTS; s++) {
      VP8SegmentInfo* const dqm = &enc->dqm[s];
      // this '>> 3' accounts for some inverse WHT scaling
      const int delta = (dqm->max_edge * dqm->y2.q[1]) >> 3;
      const int level =
          VP8FilterStrengthFromDelta(enc->filter_hdr.sharpness, delta);
      if (level > dqm->fstrength) {
        dqm->fstrength = level;
      }
      if (max_level < dqm->fstrength) {
        max_level = dqm->fstrength;
      }
    }
    enc->filter_hdr.level = max_level;
  }
}